

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# converter-mip-test.h
# Opt level: O0

bool __thiscall
mip_converter_test::MIPInstance::Objective::operator==(Objective *this,Objective *obj)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  size_t sVar4;
  uint *puVar5;
  const_reference pvVar6;
  int *in_RSI;
  int *in_RDI;
  size_t i_1;
  size_t i;
  bool eq2;
  bool eq1;
  bool local_4d;
  SparseVec *in_stack_ffffffffffffffb8;
  size_type sVar7;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  uint uVar8;
  size_type local_28;
  ulong local_20;
  
  iVar2 = *in_RDI;
  iVar1 = *in_RSI;
  bVar3 = SparseVec::operator==
                    ((SparseVec *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                     in_stack_ffffffffffffffb8);
  if (iVar2 != iVar1) {
    printf("Diff sense\n");
  }
  if (!bVar3) {
    printf("Diff coefs\n");
    local_20 = 0;
    while( true ) {
      sVar4 = SparseVec::size((SparseVec *)0x47af91);
      if (sVar4 <= local_20) break;
      puVar5 = (uint *)std::vector<int,_std::allocator<int>_>::operator[]
                                 ((vector<int,_std::allocator<int>_> *)(in_RDI + 8),local_20);
      uVar8 = *puVar5;
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 2),local_20);
      printf(" %d:%f",*pvVar6,(ulong)uVar8);
      local_20 = local_20 + 1;
    }
    printf("\n");
    local_28 = 0;
    while( true ) {
      sVar7 = local_28;
      sVar4 = SparseVec::size((SparseVec *)0x47b023);
      if (sVar4 <= sVar7) break;
      puVar5 = (uint *)std::vector<int,_std::allocator<int>_>::operator[]
                                 ((vector<int,_std::allocator<int>_> *)(in_RSI + 8),local_28);
      uVar8 = *puVar5;
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RSI + 2),local_28);
      printf(" %d:%f",*pvVar6,(ulong)uVar8);
      local_28 = local_28 + 1;
    }
    printf("\n");
  }
  local_4d = false;
  if (iVar2 == iVar1) {
    local_4d = bVar3;
  }
  return local_4d;
}

Assistant:

bool operator==(const Objective& obj) const {
      bool eq1 = sense_==obj.sense_;
      bool eq2 = le_==obj.le_;
      if (!eq1)
        printf("Diff sense\n");
      if (!eq2) {
        printf("Diff coefs\n");
        for (size_t i=0; i<le_.size(); ++i) {
          printf(" %d:%f", le_.v_[i], le_.c_[i]);
        }
        printf("\n");
        for (size_t i=0; i<obj.le_.size(); ++i) {
          printf(" %d:%f", obj.le_.v_[i], obj.le_.c_[i]);
        }
        printf("\n");
      }
      return eq1 && eq2;
    }